

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_adaptor_sig_verify
              (secp256k1_context *ctx,uchar *adaptor_sig65,secp256k1_pubkey *pubkey,uchar *msg32,
              secp256k1_pubkey *adaptor,uchar *adaptor_proof97)

{
  int iVar1;
  secp256k1_fe *rzr;
  undefined1 auVar2 [16];
  secp256k1_scalar dleq_proof_s;
  secp256k1_scalar sigr;
  secp256k1_scalar sp;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar e_neg;
  secp256k1_ge rp;
  secp256k1_ge r;
  secp256k1_gej lhs;
  secp256k1_scalar msg;
  secp256k1_scalar e_expected;
  secp256k1_ge rhs;
  secp256k1_ge q;
  secp256k1_ge adaptor_ge;
  secp256k1_ge r1;
  secp256k1_gej tmpj;
  secp256k1_ge r2;
  secp256k1_gej r2j;
  secp256k1_ge *in_stack_fffffffffffffa48;
  undefined1 local_5a8 [64];
  secp256k1_scalar local_568;
  secp256k1_scalar local_548;
  secp256k1_scalar local_528;
  secp256k1_ge local_508;
  secp256k1_ge local_4b0;
  undefined1 local_458 [88];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  int local_3e0;
  secp256k1_gej local_3d8;
  secp256k1_scalar local_358;
  secp256k1_gej local_338;
  secp256k1_gej local_2b8;
  secp256k1_ge local_238;
  secp256k1_ge local_1e0;
  secp256k1_gej local_188;
  secp256k1_ge local_108;
  secp256k1_gej local_b0;
  
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_ecdsa_adaptor_sig_verify_cold_6();
  }
  else if (adaptor_sig65 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_sig_verify_cold_5();
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_ecdsa_adaptor_sig_verify_cold_4();
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_sig_verify_cold_3();
  }
  else if (adaptor == (secp256k1_pubkey *)0x0) {
    secp256k1_ecdsa_adaptor_sig_verify_cold_2();
  }
  else if (adaptor_proof97 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_sig_verify_cold_1();
  }
  else {
    iVar1 = secp256k1_dleq_deserialize_point(&local_508,adaptor_proof97);
    if ((iVar1 != 0) &&
       (secp256k1_scalar_set_b32
                  ((secp256k1_scalar *)local_5a8,adaptor_proof97 + 0x21,(int *)local_458),
       local_458._0_4_ == 0)) {
      secp256k1_scalar_set_b32(&local_548,adaptor_proof97 + 0x41,(int *)local_458);
      if (local_458._0_4_ != 0) {
        return 0;
      }
      iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                        (&local_4b0,(secp256k1_scalar *)(local_5a8 + 0x20),&local_568,adaptor_sig65)
      ;
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_pubkey_load(ctx,&local_238,adaptor);
      if (iVar1 == 0) {
        return 0;
      }
      local_2b8.infinity = local_508.infinity;
      local_2b8.x.n[0] = local_508.x.n[0];
      local_2b8.x.n[1] = local_508.x.n[1];
      local_2b8.x.n[2] = local_508.x.n[2];
      local_2b8.x.n[3] = local_508.x.n[3];
      local_2b8.x.n[4] = local_508.x.n[4];
      local_2b8.y.n[0] = local_508.y.n[0];
      local_2b8.y.n[1] = local_508.y.n[1];
      local_2b8.y.n[2] = local_508.y.n[2];
      local_2b8.y.n[3] = local_508.y.n[3];
      local_2b8.y.n[4] = local_508.y.n[4];
      local_2b8.z.n[0] = 1;
      local_2b8.z.n[3] = 0;
      local_2b8.z.n[4] = 0;
      local_2b8.z.n[1] = 0;
      local_2b8.z.n[2] = 0;
      local_338.infinity = local_4b0.infinity;
      local_338.x.n[4] = local_4b0.x.n[4];
      local_338.x.n[2] = local_4b0.x.n[2];
      local_338.x.n[3] = local_4b0.x.n[3];
      local_338.x.n[0] = local_4b0.x.n[0];
      local_338.x.n[1] = local_4b0.x.n[1];
      local_338.y.n[4] = local_4b0.y.n[4];
      local_338.y.n[2] = local_4b0.y.n[2];
      local_338.y.n[3] = local_4b0.y.n[3];
      local_338.y.n[0] = local_4b0.y.n[0];
      local_338.y.n[1] = local_4b0.y.n[1];
      local_338.z.n[0] = 1;
      local_338.z.n[3] = 0;
      local_338.z.n[4] = 0;
      local_338.z.n[1] = 0;
      local_338.z.n[2] = 0;
      secp256k1_scalar_negate(&local_528,&local_548);
      secp256k1_ecmult(&ctx->ecmult_ctx,&local_3d8,&local_2b8,&local_528,
                       (secp256k1_scalar *)local_5a8);
      secp256k1_ecmult(&ctx->ecmult_ctx,&local_188,&local_338,&local_528,&secp256k1_scalar_zero);
      local_3e0 = local_238.infinity;
      local_458._0_8_ = local_238.x.n[0];
      local_458._8_8_ = local_238.x.n[1];
      local_458._16_8_ = local_238.x.n[2];
      local_458._24_8_ = local_238.x.n[3];
      local_458._32_8_ = local_238.x.n[4];
      local_458._40_8_ = local_238.y.n[0];
      local_458._48_8_ = local_238.y.n[1];
      local_458._56_8_ = local_238.y.n[2];
      local_458._64_8_ = local_238.y.n[3];
      local_458._72_8_ = local_238.y.n[4];
      local_458._80_8_ = 1;
      local_400 = ZEXT816(0);
      local_3f0 = ZEXT816(0);
      rzr = (secp256k1_fe *)local_5a8;
      secp256k1_ecmult(&ctx->ecmult_ctx,&local_b0,(secp256k1_gej *)local_458,(secp256k1_scalar *)rzr
                       ,&secp256k1_scalar_zero);
      secp256k1_gej_add_var(&local_b0,&local_b0,&local_188,rzr);
      secp256k1_ge_set_gej(&local_1e0,&local_3d8);
      secp256k1_ge_set_gej(&local_108,&local_b0);
      secp256k1_dleq_challenge_hash
                (&local_358,(uchar *)&local_238,&local_1e0,&local_108,&local_508,&local_4b0,
                 in_stack_fffffffffffffa48);
      iVar1 = secp256k1_scalar_add(&local_358,&local_358,&local_528);
      auVar2._0_4_ = -(uint)((int)local_358.d[2] == 0 && (int)local_358.d[0] == 0);
      auVar2._4_4_ = -(uint)(local_358.d[2]._4_4_ == 0 && local_358.d[0]._4_4_ == 0);
      auVar2._8_4_ = -(uint)((int)local_358.d[3] == 0 && (int)local_358.d[1] == 0);
      auVar2._12_4_ = -(uint)(local_358.d[3]._4_4_ == 0 && local_358.d[1]._4_4_ == 0);
      iVar1 = movmskps(iVar1,auVar2);
      if (iVar1 != 0xf) {
        return 0;
      }
      secp256k1_scalar_set_b32((secp256k1_scalar *)&local_3d8,msg32,(int *)0x0);
      iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)&local_2b8,pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_ecdsa_adaptor_sig_verify_helper
                        (ctx,(secp256k1_ge *)&local_338,(secp256k1_scalar *)(local_5a8 + 0x20),
                         &local_568,(secp256k1_ge *)&local_2b8,(secp256k1_scalar *)&local_3d8);
      if (iVar1 == 0) {
        return 0;
      }
      local_3e0 = local_508.infinity;
      local_458._0_8_ = local_508.x.n[0];
      local_458._8_8_ = local_508.x.n[1];
      local_458._16_8_ = local_508.x.n[2];
      local_458._24_8_ = local_508.x.n[3];
      local_458._32_8_ = local_508.x.n[4];
      local_458._40_8_ = local_508.y.n[0];
      local_458._48_8_ = local_508.y.n[1];
      local_458._56_8_ = local_508.y.n[2];
      local_458._64_8_ = local_508.y.n[3];
      local_458._72_8_ = local_508.y.n[4];
      local_458._80_8_ = 1;
      local_400 = (undefined1  [16])0x0;
      local_3f0 = (undefined1  [16])0x0;
      secp256k1_ge_neg((secp256k1_ge *)&local_338,(secp256k1_ge *)&local_338);
      secp256k1_gej_add_ge_var
                ((secp256k1_gej *)local_458,(secp256k1_gej *)local_458,(secp256k1_ge *)&local_338,
                 (secp256k1_fe *)0x0);
      return local_3e0;
    }
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_sig_verify(const secp256k1_context* ctx, const unsigned char *adaptor_sig65, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_pubkey *adaptor, const unsigned char *adaptor_proof97) {
    secp256k1_scalar dleq_proof_s, dleq_proof_e;
    secp256k1_scalar msg;
    secp256k1_ge q;
    secp256k1_ge r, rp;
    secp256k1_scalar sp;
    secp256k1_scalar sigr;
    secp256k1_ge adaptor_ge;
    secp256k1_ge rhs;
    secp256k1_gej lhs;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(adaptor_sig65 != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(adaptor != NULL);
    ARG_CHECK(adaptor_proof97 != NULL);

    /* 1. DLEQ_verify((G,R'),(Y, R)) */
    if (!secp256k1_ecdsa_adaptor_proof_deserialize(&rp, &dleq_proof_s, &dleq_proof_e, adaptor_proof97)) {
        return 0;
    }
    if (!secp256k1_ecdsa_adaptor_sig_deserialize(&r, &sigr, &sp, adaptor_sig65)) {
        return 0;
    }
    if (!secp256k1_pubkey_load(ctx, &adaptor_ge, adaptor)) {
        return 0;
    }
    if(!secp256k1_dleq_verify(&ctx->ecmult_ctx, (unsigned char *)"ECDSAAdaptorSig", &dleq_proof_s, &dleq_proof_e, &rp, &adaptor_ge, &r)) {
        return 0;
    }

    /* 2. return x_coord(R') == x_coord(s'⁻¹(H(m) * G + x_coord(R) * X)) */
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    if (!secp256k1_pubkey_load(ctx, &q, pubkey)) {
        return 0;
    }
    if (!secp256k1_ecdsa_adaptor_sig_verify_helper(ctx, &rhs, &sigr, &sp, &q, &msg)) {
        return 0;
    }

    secp256k1_gej_set_ge(&lhs, &rp);
    secp256k1_ge_neg(&rhs, &rhs);
    secp256k1_gej_add_ge_var(&lhs, &lhs, &rhs, NULL);
    return secp256k1_gej_is_infinity(&lhs);
}